

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::DynamicTypeHandler
          (DynamicTypeHandler *this,int slotCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots,BYTE flags)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  PropertyIndex local_2a;
  BYTE flags_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int slotCapacity_local;
  DynamicTypeHandler *this_local;
  
  this->_vptr_DynamicTypeHandler = (_func_int **)&PTR___cxa_pure_virtual_01e4e380;
  this->propertyTypes = '\x11';
  this->flags = flags;
  this->offsetOfInlineSlots = offsetOfInlineSlots;
  this->unusedBytes = 1;
  this->protoCachesWereInvalidated = false;
  bVar2 = GetIsOrMayBecomeShared(this);
  if ((bVar2) && (bVar2 = GetIsLocked(this), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x46,"(!GetIsOrMayBecomeShared() || GetIsLocked())",
                                "!GetIsOrMayBecomeShared() || GetIsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((offsetOfInlineSlots == 0) && (inlineSlotCapacity != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x47,"(offsetOfInlineSlots != 0 || inlineSlotCapacity == 0)",
                                "offsetOfInlineSlots != 0 || inlineSlotCapacity == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsObjectHeaderInlined(offsetOfInlineSlots);
  if ((bVar2) && (inlineSlotCapacity == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x48,
                                "(!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0)"
                                ,
                                "!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsObjectHeaderInlined(offsetOfInlineSlots);
  if (bVar2) {
    local_2a = RoundUpObjectHeaderInlinedInlineSlotCapacity(inlineSlotCapacity);
  }
  else {
    local_2a = RoundUpInlineSlotCapacity(inlineSlotCapacity);
  }
  this->inlineSlotCapacity = local_2a;
  iVar4 = RoundUpSlotCapacity(slotCapacity,local_2a);
  this->slotCapacity = iVar4;
  bVar2 = IsObjectHeaderInlinedTypeHandler(this);
  bVar3 = IsObjectHeaderInlined(offsetOfInlineSlots);
  if (bVar2 != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x51,
                                "(IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots))"
                                ,
                                "IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

DynamicTypeHandler::DynamicTypeHandler(int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, BYTE flags) :
        flags(flags),
        propertyTypes(PropertyTypesWritableDataOnly | PropertyTypesReserved),
        offsetOfInlineSlots(offsetOfInlineSlots),
        unusedBytes(Js::AtomTag),
        protoCachesWereInvalidated(false)
    {
        Assert(!GetIsOrMayBecomeShared() || GetIsLocked());
        Assert(offsetOfInlineSlots != 0 || inlineSlotCapacity == 0);
        Assert(!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0);

        // Align the slot capacities and set the total slot capacity
        this->inlineSlotCapacity = inlineSlotCapacity =
            IsObjectHeaderInlined(offsetOfInlineSlots)
                ? RoundUpObjectHeaderInlinedInlineSlotCapacity(inlineSlotCapacity)
                : RoundUpInlineSlotCapacity(inlineSlotCapacity);
        this->slotCapacity = RoundUpSlotCapacity(slotCapacity, inlineSlotCapacity);

        Assert(IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots));
    }